

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O3

int streamReply(mpt_reply_context *rc,mpt_message *msg)

{
  void *val;
  int iVar1;
  ulong len;
  char *pcVar2;
  uint64_t id;
  
  len = (ulong)*(ushort *)((long)&rc[1]._vptr + 2);
  if (len == 0) {
    pcVar2 = "reply already sent";
  }
  else {
    val = (void *)((long)&rc[1]._vptr + 4);
    iVar1 = mpt_stream_reply((mpt_stream *)(rc + -0x13),len,val,msg);
    if (-1 < iVar1) {
      *(undefined2 *)((long)&rc[1]._vptr + 2) = 0;
      return iVar1;
    }
    mpt_message_buf2id(val,*(undefined2 *)((long)&rc[1]._vptr + 2));
    pcVar2 = "unable to send";
  }
  mpt_log(0,"mpt::stream::reply",4,"%s: %s","bad reply operation",pcVar2);
  return -1;
}

Assistant:

static int streamReply(MPT_INTERFACE(reply_context) *rc, const MPT_STRUCT(message) *msg)
{
	MPT_STRUCT(streamInput) *srm = MPT_baseaddr(streamInput, rc, _rc);
	static const char _func[] = "mpt::stream::reply";
	int ret;
	
	if (!srm->rd.len) {
		mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
		        MPT_tr("bad reply operation"), MPT_tr("reply already sent"));
		return MPT_ERROR(BadArgument);
	}
	ret = mpt_stream_reply(&srm->data, srm->rd.len, srm->rd.val, msg);
	
	if (ret >= 0) {
		srm->rd.len = 0;
	} else {
		uint64_t id = 0;
		mpt_message_buf2id(srm->rd.val, srm->rd.len, &id);
		mpt_log(0, _func, MPT_LOG(Warning), "%s: %s",
		        MPT_tr("bad reply operation"), MPT_tr("unable to send"));
		return MPT_ERROR(BadArgument);
	}
	return ret;
}